

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_push.c
# Opt level: O1

ssize_t mpt_stream_push(mpt_stream *stream,size_t len,void *src)

{
  mpt_encode_queue *pmVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char *__s;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong unaff_R14;
  ulong local_58;
  
  uVar3 = mpt_stream_flags(&stream->_info);
  uVar2 = uVar3 & 0xffffffdf;
  if (-1 < (char)uVar3) {
    uVar2 = uVar3;
  }
  pmVar1 = &stream->_wd;
  uVar9 = 0;
  do {
    if (len == 0) {
      if ((stream->_wd)._enc == (mpt_data_encoder_t)0x0) {
        uVar8 = (stream->_wd).data.max - (stream->_wd).data.len;
        __s = (char *)mpt_newline_string(uVar2 >> 0xe & 3);
        if (__s == (char *)0x0) {
          sVar6 = 0;
        }
        else {
          sVar6 = strlen(__s);
        }
        uVar4 = 0xffffffffffffffef;
        if (sVar6 <= uVar8) {
          if (__s != (char *)0x0) {
            mpt_queue_push(pmVar1,sVar6,__s);
          }
          mpt_queue_push(pmVar1,0,0);
          *(byte *)&(stream->_info)._fd = (byte)(stream->_info)._fd & 0xfb;
          local_58 = 0;
          uVar4 = unaff_R14;
        }
        if (uVar8 < sVar6) goto LAB_00107e14;
        bVar7 = true;
        len = 0;
      }
      else {
        uVar4 = mpt_queue_push(pmVar1,0,0);
        if ((long)uVar4 < 0) goto LAB_00107e14;
        *(byte *)&(stream->_info)._fd = (byte)(stream->_info)._fd & 0xfb;
        bVar7 = true;
        len = 0;
        local_58 = uVar4;
      }
    }
    else {
      uVar4 = mpt_queue_push(pmVar1,len,src);
LAB_00107e14:
      if ((long)uVar4 < 0) {
        if (uVar4 == 0xffffffffffffffef) {
          if ((uVar2 & 0xa0) == 0x20) {
            lVar5 = mpt_queue_prepare(pmVar1);
            bVar7 = false;
            uVar4 = 0xffffffffffffffef;
            if (lVar5 == 0) {
              local_58 = uVar9;
              if (uVar9 == 0) {
                local_58 = 0xfffffffffffffffc;
              }
              goto LAB_00107ed3;
            }
          }
          else {
            bVar7 = true;
            uVar4 = 0xffffffffffffffef;
            local_58 = -(ulong)(uVar9 == 0) | uVar9;
          }
        }
        else {
          local_58 = uVar9;
          if (uVar9 == 0) {
            local_58 = uVar4;
          }
LAB_00107ed3:
          bVar7 = true;
        }
      }
      else {
        *(byte *)&(stream->_info)._fd = (byte)(stream->_info)._fd | 4;
        uVar9 = uVar9 + uVar4;
        len = len - uVar4;
        if (len == 0) {
          bVar7 = true;
          len = 0;
          local_58 = uVar9;
        }
        else {
          src = (void *)((long)src + uVar4);
          bVar7 = false;
        }
      }
    }
    unaff_R14 = uVar4;
    if (bVar7) {
      return local_58;
    }
  } while( true );
}

Assistant:

extern ssize_t mpt_stream_push(MPT_STRUCT(stream) *stream, size_t len, const void *src)
{
	ssize_t total = 0;
	int flags = mpt_stream_flags(&stream->_info);
	
	if (flags & MPT_STREAMFLAG(WriteMap)) {
		flags &= ~MPT_STREAMFLAG(WriteBuf);
	}
	
	while (1) {
		ssize_t post;
		
		/* error during data append */
		if (len) {
			post = mpt_queue_push(&stream->_wd, len, src);
		}
		/* terminate current message */
		else {
			if (!stream->_wd._enc) {
				const char *fmt;
				size_t add, rem;
				
				rem = stream->_wd.data.max - stream->_wd.data.len;
				fmt = mpt_newline_string(MPT_stream_newline_write(flags));
				add = fmt ? strlen(fmt) : 0;
				if (rem >= add) {
					if (fmt) {
						mpt_queue_push(&stream->_wd, add, fmt);
					}
					/* mark segment as done */
					mpt_queue_push(&stream->_wd, 0, 0);
					stream->_info._fd &= ~MPT_STREAMFLAG(MesgActive);
					return 0;
				}
				post = MPT_ERROR(MissingBuffer);
			}
			else if ((post = mpt_queue_push(&stream->_wd, 0, 0)) >= 0) {
				stream->_info._fd &= ~MPT_STREAMFLAG(MesgActive);
				return post;
			}
		}
		/* pushed some data */
		if (post >= 0) {
			stream->_info._fd |= MPT_STREAMFLAG(MesgActive);
			total += post;
			/* push operation finished */
			if (!(len -= post)) {
				return total;
			}
			src = ((uint8_t *) src) + post;
			continue;
		}
		/* incompatible error state */
		if (post != MPT_ERROR(MissingBuffer)) {
			return total ? total : post;
		}
		/* queue not resizable */
		if (!(flags & MPT_STREAMFLAG(WriteBuf))
		    || (flags & MPT_STREAMFLAG(WriteMap))) {
			return total ? total : MPT_ERROR(BadArgument);
		}
		/* append queue data */
		if (!mpt_queue_prepare(&stream->_wd.data, 256)) {
			return total ? total : MPT_ERROR(BadOperation);
		}
	}
}